

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCVS.cxx
# Opt level: O2

bool __thiscall cmCTestCVS::LogParser::ProcessLine(LogParser *this)

{
  string *__lhs;
  string *psVar1;
  RegularExpression *this_00;
  SectionType SVar2;
  bool bVar3;
  string local_40;
  
  __lhs = &(this->super_LineParser).Line;
  bVar3 = std::operator==(__lhs,
                          "============================================================================="
                         );
  if (bVar3) {
    if (this->Section == SectionRevisions) {
      FinishRevision(this);
    }
    this->Section = SectionEnd;
    goto LAB_00332c0c;
  }
  bVar3 = std::operator==(__lhs,"----------------------------");
  SVar2 = this->Section;
  if (bVar3) {
    if (SVar2 == SectionRevisions) {
      FinishRevision(this);
    }
    else if (SVar2 == SectionHeader) {
      this->Section = SectionRevisions;
    }
    goto LAB_00332c0c;
  }
  if (SVar2 != SectionRevisions) goto LAB_00332c0c;
  psVar1 = &(this->Rev).Log;
  if ((this->Rev).Log._M_string_length == 0) {
    if ((this->Rev).Rev._M_string_length == 0) {
      bVar3 = cmsys::RegularExpression::find(&this->RegexRevision,__lhs);
      if (!bVar3) goto LAB_00332cd3;
      cmsys::RegularExpression::match_abi_cxx11_(&local_40,&this->RegexRevision,1);
      std::__cxx11::string::operator=((string *)&this->Rev,(string *)&local_40);
LAB_00332d45:
      std::__cxx11::string::~string((string *)&local_40);
      goto LAB_00332c0c;
    }
LAB_00332cd3:
    if ((this->Rev).Date._M_string_length == 0) {
      this_00 = &this->RegexPerson;
      bVar3 = cmsys::RegularExpression::find(this_00,__lhs);
      if (bVar3) {
        cmsys::RegularExpression::match_abi_cxx11_(&local_40,this_00,1);
        std::__cxx11::string::operator=((string *)&(this->Rev).Date,(string *)&local_40);
        std::__cxx11::string::~string((string *)&local_40);
        cmsys::RegularExpression::match_abi_cxx11_(&local_40,this_00,2);
        std::__cxx11::string::operator=((string *)&(this->Rev).Author,(string *)&local_40);
        goto LAB_00332d45;
      }
    }
    bVar3 = cmsys::RegularExpression::find(&this->RegexBranches,__lhs);
    if (bVar3) goto LAB_00332c0c;
  }
  std::__cxx11::string::append((string *)psVar1);
  std::__cxx11::string::append((char *)psVar1);
LAB_00332c0c:
  return this->Section != SectionEnd;
}

Assistant:

bool ProcessLine() CM_OVERRIDE
  {
    if (this->Line == ("======================================="
                       "======================================")) {
      // This line ends the revision list.
      if (this->Section == SectionRevisions) {
        this->FinishRevision();
      }
      this->Section = SectionEnd;
    } else if (this->Line == "----------------------------") {
      // This line divides revisions from the header and each other.
      if (this->Section == SectionHeader) {
        this->Section = SectionRevisions;
      } else if (this->Section == SectionRevisions) {
        this->FinishRevision();
      }
    } else if (this->Section == SectionRevisions) {
      if (!this->Rev.Log.empty()) {
        // Continue the existing log.
        this->Rev.Log += this->Line;
        this->Rev.Log += "\n";
      } else if (this->Rev.Rev.empty() &&
                 this->RegexRevision.find(this->Line)) {
        this->Rev.Rev = this->RegexRevision.match(1);
      } else if (this->Rev.Date.empty() &&
                 this->RegexPerson.find(this->Line)) {
        this->Rev.Date = this->RegexPerson.match(1);
        this->Rev.Author = this->RegexPerson.match(2);
      } else if (!this->RegexBranches.find(this->Line)) {
        // Start the log.
        this->Rev.Log += this->Line;
        this->Rev.Log += "\n";
      }
    }
    return this->Section != SectionEnd;
  }